

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_echo_server.cpp
# Opt level: O2

void __thiscall EchoServer::printThroughput(EchoServer *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Timestamp high;
  double dVar4;
  double dVar5;
  double dVar6;
  
  high = sznet::Timestamp::now();
  lVar2 = (this->m_transferred).super___atomic_base<long>._M_i;
  lVar3 = this->m_oldCounter;
  LOCK();
  lVar1 = (this->m_receivedMessages).super___atomic_base<long>._M_i;
  (this->m_receivedMessages).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  dVar4 = sznet::timeDifference(high,(Timestamp)(this->m_startTime).m_microSecondsSinceEpoch);
  dVar5 = (double)(lVar2 - lVar3);
  dVar6 = (double)lVar1;
  printf("%4.3f MiB/s %4.3f Ki Msgs/s %6.2f bytes per msg\n",
         (dVar5 / dVar4) * 0.0009765625 * 0.0009765625,(dVar6 / dVar4) * 0.0009765625,dVar5 / dVar6)
  ;
  this->m_oldCounter = lVar2;
  (this->m_startTime).m_microSecondsSinceEpoch = high.m_microSecondsSinceEpoch;
  return;
}

Assistant:

void printThroughput()
    {
        Timestamp endTime = Timestamp::now();
        int64_t newCounter = m_transferred;
        int64_t bytes = newCounter - m_oldCounter;
        int64_t msgs = m_receivedMessages.exchange(0);
        double time = timeDifference(endTime, m_startTime);
        printf("%4.3f MiB/s %4.3f Ki Msgs/s %6.2f bytes per msg\n",
            static_cast<double>(bytes) / time / 1024 / 1024,
            static_cast<double>(msgs) / time / 1024,
            static_cast<double>(bytes) / static_cast<double>(msgs));

        m_oldCounter = newCounter;
        m_startTime = endTime;
    }